

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::SetRawIssueAsset
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxInIssuanceParameters,_std::allocator<cfd::api::TxInIssuanceParameters>_>
          *issuances,
          vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
          *issuance_output)

{
  Txid *pTVar1;
  Txid *txid;
  ByteData token_nonce;
  ByteData asset_nonce;
  IssuanceOutput output;
  IssuanceParameter issuance_param;
  Script token_locking_script;
  Script asset_locking_script;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  txid = *(Txid **)issuances;
  pTVar1 = *(Txid **)(issuances + 8);
  if (txid != pTVar1) {
    do {
      core::AbstractTxOut::GetLockingScript
                (&asset_locking_script,
                 (AbstractTxOut *)
                 &txid[1].data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      core::ConfidentialNonce::ConfidentialNonce
                ((ConfidentialNonce *)&output,
                 (ConfidentialNonce *)
                 &txid[6].data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      core::ConfidentialNonce::GetData(&asset_nonce,(ConfidentialNonce *)&output);
      output.txid._vptr_Txid = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
      if (output.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(output.txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)output.txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)output.txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      core::AbstractTxOut::GetLockingScript(&token_locking_script,(AbstractTxOut *)(txid + 10));
      core::ConfidentialNonce::ConfidentialNonce
                ((ConfidentialNonce *)&output,(ConfidentialNonce *)(txid + 0xf));
      core::ConfidentialNonce::GetData(&token_nonce,(ConfidentialNonce *)&output);
      output.txid._vptr_Txid = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
      if (output.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(output.txid.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)output.txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)output.txid.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ConfidentialTransactionController::SetAssetIssuance
                (&issuance_param,__return_storage_ptr__,txid,*(uint32_t *)&txid[1]._vptr_Txid,
                 (Amount *)&txid[1].data_,&asset_locking_script,&asset_nonce,
                 (Amount *)
                 &txid[9].data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish,&token_locking_script,&token_nonce,
                 *(bool *)&txid[0x12].data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,
                 (ByteData256 *)
                 &txid[0x11].data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,false,false);
      if (issuance_output !=
          (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)0x0) {
        IssuanceOutput::IssuanceOutput(&output);
        core::Txid::operator=(&output.txid,txid);
        output.vout = *(uint32_t *)&txid[1]._vptr_Txid;
        core::ConfidentialAssetId::operator=(&output.output.asset,&issuance_param.asset);
        core::BlindFactor::operator=(&output.output.entropy,&issuance_param.entropy);
        core::ConfidentialAssetId::operator=(&output.output.token,&issuance_param.token);
        std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::push_back
                  (issuance_output,&output);
        output.output.token._vptr_ConfidentialAssetId =
             (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
        if (output.output.token.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(output.output.token.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)output.output.token.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)output.output.token.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        output.output.asset._vptr_ConfidentialAssetId =
             (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
        if (output.output.asset.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(output.output.asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)output.output.asset.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)output.output.asset.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        output.output.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0087ca68;
        if (output.output.entropy.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(output.output.entropy.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)output.output.entropy.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)output.output.entropy.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        output.txid._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
        if (output.txid.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(output.txid.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)output.txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)output.txid.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      issuance_param.token._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
      if (issuance_param.token.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(issuance_param.token.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)issuance_param.token.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)issuance_param.token.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      issuance_param.asset._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
      if (issuance_param.asset.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(issuance_param.asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)issuance_param.asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)issuance_param.asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      issuance_param.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0087ca68;
      if (issuance_param.entropy.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(issuance_param.entropy.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)issuance_param.entropy.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)issuance_param.entropy.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (token_nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(token_nonce.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)token_nonce.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)token_nonce.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      core::Script::~Script(&token_locking_script);
      if (asset_nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(asset_nonce.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)asset_nonce.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)asset_nonce.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      core::Script::~Script(&asset_locking_script);
      txid = (Txid *)&txid[0x12].data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
    } while (txid != pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::SetRawIssueAsset(
    const std::string& tx_hex,
    const std::vector<TxInIssuanceParameters>& issuances,
    std::vector<IssuanceOutput>* issuance_output) {
  ConfidentialTransactionController ctxc(tx_hex);

  for (const auto& issuance : issuances) {
    Script asset_locking_script = issuance.asset_txout.GetLockingScript();
    ByteData asset_nonce = issuance.asset_txout.GetNonce().GetData();
    Script token_locking_script = issuance.token_txout.GetLockingScript();
    ByteData token_nonce = issuance.token_txout.GetNonce().GetData();

    IssuanceParameter issuance_param = ctxc.SetAssetIssuance(
        issuance.txid, issuance.vout, issuance.asset_amount,
        asset_locking_script, asset_nonce, issuance.token_amount,
        token_locking_script, token_nonce, issuance.is_blind,
        issuance.contract_hash, false);

    if (issuance_output != nullptr) {
      IssuanceOutput output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.output.asset = issuance_param.asset;
      output.output.entropy = issuance_param.entropy;
      output.output.token = issuance_param.token;
      issuance_output->push_back(output);
    }
  }
  return ctxc;
}